

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t *
Acb_FindSupportMinOne
          (sat_solver *pSat,int iFirstDiv,Vec_Wrd_t *vPats,int *pnPats,Vec_Int_t *vSupp,int iVar)

{
  int iVar1;
  Vec_Int_t *p;
  word *pwVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = vPats->nSize;
  p = Vec_IntAlloc(vSupp->nSize);
  for (iVar4 = 0; iVar4 < vSupp->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vSupp,iVar4);
    if (iVar != iVar4) {
      Vec_IntPush(p,iVar1);
    }
  }
  iVar3 = iVar3 / 0x100;
  iVar4 = sat_solver_solve(pSat,p->pArray,p->pArray + p->nSize,0,0,0,0);
  if (iVar4 != -1) {
    Vec_IntFree(p);
    if (iVar4 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                    ,0x40b,
                    "Vec_Int_t *Acb_FindSupportMinOne(sat_solver *, int, Vec_Wrd_t *, int *, Vec_Int_t *, int)"
                   );
    }
    iVar4 = 0;
    if (iVar3 < 1) {
      iVar3 = iVar4;
    }
    for (; iVar3 << 8 != iVar4; iVar4 = iVar4 + 0x100) {
      iVar1 = sat_solver_var_value(pSat,iFirstDiv);
      if (iVar1 != 0) {
        pwVar2 = Vec_WrdEntryP(vPats,iVar4);
        pwVar2[*pnPats >> 6] = pwVar2[*pnPats >> 6] | 1L << ((byte)*pnPats & 0x3f);
      }
      iFirstDiv = iFirstDiv + 1;
    }
    iVar3 = *pnPats;
    *pnPats = iVar3 + 1;
    p = vSupp;
    if (iVar3 + 1 == 0x4000) {
      p = (Vec_Int_t *)0x0;
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_FindSupportMinOne( sat_solver * pSat, int iFirstDiv, Vec_Wrd_t * vPats, int * pnPats, Vec_Int_t * vSupp, int iVar )
{
    int i, iLit, status;
    int nDivs = Vec_WrdSize(vPats)/NWORDS;
    Vec_Int_t * vLits = Vec_IntAlloc( Vec_IntSize(vSupp) );
    Vec_IntForEachEntry( vSupp, iLit, i )
        if ( i != iVar )
            Vec_IntPush( vLits, iLit );
    // try one run
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
    if ( status == l_False )
        return vLits;
    Vec_IntFree( vLits );
    assert( status == l_True );
    // collect pattern
    for ( i = 0; i < nDivs; i++ )
    {
        if ( sat_solver_var_value(pSat, iFirstDiv+i) == 0 )
            continue;
        Abc_TtSetBit( Vec_WrdEntryP(vPats, NWORDS*i), *pnPats );
    }
    (*pnPats)++;
    if ( *pnPats == NWORDS*64 )
        return NULL;
    return vSupp;
}